

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void __thiscall
AlignmentRecord::mergeAlignmentRecordsMixed(AlignmentRecord *this,AlignmentRecord *ar)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  pointer *ppcVar2;
  shared_count *psVar3;
  char *pcVar4;
  pointer pcVar5;
  pointer piVar6;
  pointer pCVar7;
  pointer pcVar8;
  iterator iVar9;
  bool bVar10;
  _Alloc_hider _Var11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  size_type sVar18;
  int iVar19;
  AlignmentRecord *pAVar20;
  int *piVar21;
  int iVar22;
  int ref_p_s_pos1;
  int ref_s_pos1;
  int ref_rel_pos1;
  int ref_rel_pos2;
  int c_pos1;
  int q_pos1;
  int local_14c;
  int local_148;
  uint local_144;
  uint local_140;
  int q_p_pos1;
  string qualities;
  int *local_118;
  int c_p_pos1;
  string ref;
  string nucigar;
  string dna;
  char i;
  undefined7 uStack_a7;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_a0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  string algn;
  vector<char,_std::allocator<char>_> *__range1_1;
  
  dna._M_dataplus._M_p = (pointer)&dna.field_2;
  if (ar->single_end == true) {
    dna._M_string_length = 0;
    dna.field_2._M_local_buf[0] = '\0';
    qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
    qualities._M_string_length = 0;
    qualities.field_2._M_local_buf[0] = '\0';
    nucigar._M_dataplus._M_p = (pointer)&nucigar.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&nucigar,"");
    ref._M_dataplus._M_p = (pointer)&ref.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ref,"");
    algn._M_dataplus._M_p = (pointer)&algn.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&algn,"");
    pcVar17 = (ar->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar4 = (ar->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar17 == pcVar4) {
      iVar19 = 0;
    }
    else {
      iVar19 = 0;
      do {
        pcVar15 = pcVar17 + 1;
        if ((*pcVar17 == 'S') || (bVar10 = true, *pcVar17 == 'H')) {
          iVar19 = iVar19 + 1;
          bVar10 = false;
        }
      } while ((!bVar10) && (pcVar17 = pcVar15, pcVar15 != pcVar4));
    }
    iVar12 = computeRevOffset(&ar->cigar1_unrolled);
    pvVar1 = &this->cigar1_unrolled;
    pcVar17 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar4 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar17 == pcVar4) {
      iVar22 = 0;
    }
    else {
      iVar22 = 0;
      do {
        pcVar15 = pcVar17 + 1;
        if ((*pcVar17 == 'S') || (bVar10 = true, *pcVar17 == 'H')) {
          iVar22 = iVar22 + 1;
          bVar10 = false;
        }
      } while ((!bVar10) && (pcVar17 = pcVar15, pcVar15 != pcVar4));
    }
    computeRevOffset(pvVar1);
    iVar13 = computeRevOffset(&this->cigar2_unrolled);
    iVar19 = ar->start1 - iVar19;
    local_144 = ar->end1;
    iVar22 = this->start1 - iVar22;
    local_140 = iVar13 + this->end2;
    q_pos1 = 0;
    q_p_pos1 = 0;
    local_148 = 0;
    c_pos1 = 0;
    c_p_pos1 = 0;
    local_14c = 0;
    ref_rel_pos1 = 0;
    ref_rel_pos2 = 0;
    ref_p_s_pos1 = iVar22;
    ref_s_pos1 = iVar19;
    if (local_144 < this->start2) {
      mergeAlignmentRecordsSingle(this,ar,1,1);
      this->single_end = false;
    }
    else if (this->end1 < ar->start1) {
      mergeAlignmentRecordsSingle(this,ar,2,1);
    }
    else {
      local_144 = local_144 + iVar12;
      if (iVar22 < iVar19) {
        while (iVar12 = ref_rel_pos1, ref_p_s_pos1 < iVar19) {
          noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos1,&q_p_pos1,&ref_p_s_pos1,
                         &ref_rel_pos1,1);
        }
        ref_rel_pos2 = ref_rel_pos1;
        while ((uint)ref_p_s_pos1 <= this->end1) {
          overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_p_pos1,&c_pos1,&q_p_pos1,
                       &q_pos1,&ref_p_s_pos1,&ref_rel_pos1,1,1);
        }
        ref_rel_pos2 = ref_rel_pos1 - iVar12;
        local_118 = &ref_rel_pos2;
        while ((uint)ref_p_s_pos1 < this->start2) {
          noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,
                         &ref_rel_pos2,1);
        }
        ref_rel_pos1 = 0;
        pcVar17 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar4 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar19 = local_14c;
        if (pcVar17 != pcVar4) {
          iVar22 = (int)pcVar4 + local_14c;
          iVar12 = (int)pcVar17;
          do {
            if (*pcVar17 != 'H') {
              iVar19 = local_14c;
              if (*pcVar17 != 'S') break;
              local_148 = local_148 + 1;
            }
            local_14c = local_14c + 1;
            pcVar17 = pcVar17 + 1;
            iVar19 = iVar22 - iVar12;
          } while (pcVar17 != pcVar4);
        }
        local_14c = iVar19;
        uVar16 = local_144;
        if ((int)local_140 < (int)local_144) {
          uVar16 = local_140;
        }
        while (ref_p_s_pos1 <= (int)uVar16) {
          overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&local_14c,&c_pos1,&local_148,
                       &q_pos1,&ref_p_s_pos1,&ref_rel_pos1,2,1);
        }
        ref_rel_pos2 = ref_rel_pos1 + ref_rel_pos2 + -1;
        if (ref_p_s_pos1 - 1U == local_140) {
          while (ref_p_s_pos1 <= (int)local_144) {
            noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,
                           &ref_rel_pos2,1);
          }
          iVar19 = 1;
          pAVar20 = ar;
LAB_00170042:
          updateReference(pAVar20,&ref,iVar19,*local_118);
        }
        else if (ref_p_s_pos1 - 1U == local_144) {
          while (ref_p_s_pos1 <= (int)local_140) {
            noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&local_14c,&local_148,
                           &ref_p_s_pos1,&ref_rel_pos1,2);
          }
          iVar19 = 2;
          local_118 = &ref_rel_pos1;
          pAVar20 = this;
          goto LAB_00170042;
        }
        uVar16 = this->start1;
        if (ar->start1 < this->start1) {
          uVar16 = ar->start1;
        }
        this->start1 = uVar16;
        uVar16 = this->end2;
        if (this->end2 < ar->end1) {
          uVar16 = ar->end1;
        }
        this->end1 = uVar16;
        this->single_end = true;
        createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
        pCVar7 = (this->cigar1).
                 super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
        _M_impl.super__Vector_impl_data._M_start = _i;
        (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)sStack_a0.px;
        (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sStack_a0.pn.pi_;
        _i = (pointer)0x0;
        sStack_a0.px = (element_type *)0x0;
        sStack_a0.pn.pi_ = (sp_counted_base *)0x0;
        if (pCVar7 != (pointer)0x0) {
          operator_delete(pCVar7);
        }
        if (_i != (pointer)0x0) {
          operator_delete(_i);
        }
        ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).forward,&sStack_a0);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).forward_qualities,&local_90);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).backward,&local_80);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).backward_qualities,&local_70);
        ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
        if (qualities._M_string_length == 0) {
          iVar19 = 0;
        }
        else {
          sVar18 = 0;
          iVar19 = 0;
          do {
            iVar19 = iVar19 + qualities._M_dataplus._M_p[sVar18] + -0x21;
            sVar18 = sVar18 + 1;
          } while (qualities._M_string_length != sVar18);
        }
        this->phred_sum1 = iVar19;
        sVar14 = ShortDnaSequence::size(&this->sequence1);
        this->length_incl_deletions1 = (int)sVar14;
        sVar14 = ShortDnaSequence::size(&this->sequence1);
        _Var11 = nucigar._M_dataplus;
        this->length_incl_longdeletions1 = (int)sVar14;
        pcVar8 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish != pcVar8) {
          (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar8;
        }
        if (nucigar._M_string_length != 0) {
          sVar18 = 0;
          do {
            _i = (pointer)CONCAT71(uStack_a7,_Var11._M_p[sVar18]);
            iVar9._M_current =
                 (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                        ((vector<char,std::allocator<char>> *)pvVar1,iVar9,&i);
            }
            else {
              *iVar9._M_current = _Var11._M_p[sVar18];
              ppcVar2 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppcVar2 = *ppcVar2 + 1;
            }
            sVar18 = sVar18 + 1;
          } while (nucigar._M_string_length != sVar18);
        }
        std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
        std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
      }
      else {
        local_118 = &ref_rel_pos2;
        while (ref_s_pos1 < iVar22) {
          noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                         &ref_rel_pos2,1);
        }
        while ((uint)ref_s_pos1 <= this->end1) {
          overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_p_pos1,&c_pos1,&q_p_pos1,
                       &q_pos1,&ref_s_pos1,&ref_rel_pos1,1,1);
        }
        ref_rel_pos2 = ref_rel_pos2 + ref_rel_pos1;
        while ((uint)ref_s_pos1 < this->start2) {
          noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                         &ref_rel_pos2,1);
        }
        ref_rel_pos1 = 0;
        pcVar17 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar4 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar19 = local_14c;
        if (pcVar17 != pcVar4) {
          iVar22 = (int)pcVar4 + local_14c;
          iVar12 = (int)pcVar17;
          do {
            if (*pcVar17 != 'H') {
              iVar19 = local_14c;
              if (*pcVar17 != 'S') break;
              local_148 = local_148 + 1;
            }
            local_14c = local_14c + 1;
            pcVar17 = pcVar17 + 1;
            iVar19 = iVar22 - iVar12;
          } while (pcVar17 != pcVar4);
        }
        local_14c = iVar19;
        uVar16 = local_144;
        if ((int)local_140 < (int)local_144) {
          uVar16 = local_140;
        }
        while (ref_s_pos1 <= (int)uVar16) {
          overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&local_14c,&c_pos1,&local_148,
                       &q_pos1,&ref_s_pos1,&ref_rel_pos1,2,1);
        }
        ref_rel_pos2 = ref_rel_pos2 + ref_rel_pos1;
        if (ref_s_pos1 - 1U == local_140) {
          while (ref_s_pos1 <= (int)local_144) {
            noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                           &ref_rel_pos2,1);
          }
          iVar19 = 1;
          pAVar20 = ar;
LAB_0017044c:
          updateReference(pAVar20,&ref,iVar19,*local_118);
        }
        else if (ref_s_pos1 - 1U == local_144) {
          while (ref_s_pos1 <= (int)local_140) {
            noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&local_14c,&local_148,
                           &ref_s_pos1,&ref_rel_pos1,2);
          }
          iVar19 = 2;
          local_118 = &ref_rel_pos1;
          pAVar20 = this;
          goto LAB_0017044c;
        }
        uVar16 = this->start1;
        if (ar->start1 < this->start1) {
          uVar16 = ar->start1;
        }
        this->start1 = uVar16;
        uVar16 = this->end2;
        if (this->end2 < ar->end1) {
          uVar16 = ar->end1;
        }
        this->end1 = uVar16;
        this->single_end = true;
        createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
        pCVar7 = (this->cigar1).
                 super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
        _M_impl.super__Vector_impl_data._M_start = _i;
        (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)sStack_a0.px;
        (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sStack_a0.pn.pi_;
        _i = (pointer)0x0;
        sStack_a0.px = (element_type *)0x0;
        sStack_a0.pn.pi_ = (sp_counted_base *)0x0;
        if (pCVar7 != (pointer)0x0) {
          operator_delete(pCVar7);
        }
        if (_i != (pointer)0x0) {
          operator_delete(_i);
        }
        ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).forward,&sStack_a0);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).forward_qualities,&local_90);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).backward,&local_80);
        boost::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&(this->sequence1).backward_qualities,&local_70);
        ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
        if (qualities._M_string_length == 0) {
          iVar19 = 0;
        }
        else {
          sVar18 = 0;
          iVar19 = 0;
          do {
            iVar19 = iVar19 + qualities._M_dataplus._M_p[sVar18] + -0x21;
            sVar18 = sVar18 + 1;
          } while (qualities._M_string_length != sVar18);
        }
        this->phred_sum1 = iVar19;
        sVar14 = ShortDnaSequence::size(&this->sequence1);
        this->length_incl_deletions1 = (int)sVar14;
        sVar14 = ShortDnaSequence::size(&this->sequence1);
        _Var11 = nucigar._M_dataplus;
        this->length_incl_longdeletions1 = (int)sVar14;
        pcVar8 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish != pcVar8) {
          (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar8;
        }
        if (nucigar._M_string_length != 0) {
          sVar18 = 0;
          do {
            _i = (pointer)CONCAT71(uStack_a7,_Var11._M_p[sVar18]);
            iVar9._M_current =
                 (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                        ((vector<char,std::allocator<char>> *)pvVar1,iVar9,&i);
            }
            else {
              *iVar9._M_current = _Var11._M_p[sVar18];
              ppcVar2 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppcVar2 = *ppcVar2 + 1;
            }
            sVar18 = sVar18 + 1;
          } while (nucigar._M_string_length != sVar18);
        }
        std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
        std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
      }
      std::vector<int,std::allocator<int>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((vector<int,std::allocator<int>> *)&this->qualityList1,qualities._M_dataplus._M_p,
                 qualities._M_dataplus._M_p + qualities._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)algn._M_dataplus._M_p != &algn.field_2) {
      operator_delete(algn._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ref._M_dataplus._M_p != &ref.field_2) {
      operator_delete(ref._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nucigar._M_dataplus._M_p != &nucigar.field_2) {
      operator_delete(nucigar._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)qualities._M_dataplus._M_p != &qualities.field_2) {
      operator_delete(qualities._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dna._M_dataplus._M_p == &dna.field_2) {
      return;
    }
    goto LAB_00170958;
  }
  dna._M_string_length = 0;
  dna.field_2._M_local_buf[0] = '\0';
  qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
  qualities._M_string_length = 0;
  qualities.field_2._M_local_buf[0] = '\0';
  nucigar._M_dataplus._M_p = (pointer)&nucigar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nucigar,"");
  ref._M_dataplus._M_p = (pointer)&ref.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ref,"");
  algn._M_dataplus._M_p = (pointer)&algn.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&algn,"");
  pvVar1 = &this->cigar1_unrolled;
  pcVar17 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar4 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar17 == pcVar4) {
    iVar19 = 0;
  }
  else {
    iVar19 = 0;
    do {
      pcVar15 = pcVar17 + 1;
      if ((*pcVar17 == 'S') || (bVar10 = true, *pcVar17 == 'H')) {
        iVar19 = iVar19 + 1;
        bVar10 = false;
      }
    } while ((!bVar10) && (pcVar17 = pcVar15, pcVar15 != pcVar4));
  }
  iVar12 = computeRevOffset(pvVar1);
  pcVar17 = (ar->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar4 = (ar->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar17 == pcVar4) {
    iVar22 = 0;
  }
  else {
    iVar22 = 0;
    do {
      pcVar15 = pcVar17 + 1;
      if ((*pcVar17 == 'S') || (bVar10 = true, *pcVar17 == 'H')) {
        iVar22 = iVar22 + 1;
        bVar10 = false;
      }
    } while ((!bVar10) && (pcVar17 = pcVar15, pcVar15 != pcVar4));
  }
  computeRevOffset(&ar->cigar1_unrolled);
  iVar13 = computeRevOffset(&ar->cigar2_unrolled);
  iVar19 = this->start1 - iVar19;
  local_144 = this->end1;
  iVar22 = ar->start1 - iVar22;
  local_140 = iVar13 + ar->end2;
  q_pos1 = 0;
  q_p_pos1 = 0;
  local_148 = 0;
  c_pos1 = 0;
  c_p_pos1 = 0;
  local_14c = 0;
  ref_rel_pos1 = 0;
  ref_rel_pos2 = 0;
  ref_p_s_pos1 = iVar22;
  ref_s_pos1 = iVar19;
  if (local_144 < ar->start2) {
    mergeAlignmentRecordsSingle(this,ar,1,1);
    uVar16 = ar->end2;
    this->start2 = ar->start2;
    this->end2 = uVar16;
    this->single_end = false;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar2,&ar->cigar2);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward,&(ar->sequence2).forward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward_qualities,&(ar->sequence2).forward_qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward,&(ar->sequence2).backward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward_qualities,&(ar->sequence2).backward_qualities);
    this->phred_sum2 = ar->phred_sum2;
    iVar19 = ar->length_incl_longdeletions2;
    this->length_incl_deletions2 = ar->length_incl_deletions2;
    this->length_incl_longdeletions2 = iVar19;
    std::vector<char,_std::allocator<char>_>::operator=(&this->cigar2_unrolled,&ar->cigar2_unrolled)
    ;
    psVar3 = &sStack_a0.pn;
    pcVar5 = (ar->reference_seq2)._M_dataplus._M_p;
    _i = (pointer)psVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&i,pcVar5,pcVar5 + (ar->reference_seq2)._M_string_length);
    std::__cxx11::string::operator=((string *)&this->reference_seq2,(string *)&i);
    if (_i != (pointer)psVar3) {
      operator_delete(_i);
    }
    pcVar5 = (ar->alignSequence2)._M_dataplus._M_p;
    _i = (pointer)psVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&i,pcVar5,pcVar5 + (ar->alignSequence2)._M_string_length);
    std::__cxx11::string::operator=((string *)&this->alignSequence2,(string *)&i);
    if (_i != (pointer)psVar3) {
      operator_delete(_i);
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&i,&ar->qualityList2);
    piVar6 = (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_i;
    (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_a0.px;
    (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)sStack_a0.pn.pi_;
    _i = (pointer)0x0;
    sStack_a0.px = (element_type *)0x0;
    sStack_a0.pn.pi_ = (sp_counted_base *)0x0;
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6);
    }
joined_r0x0016f3d8:
    if (_i != (pointer)0x0) {
      operator_delete(_i);
    }
  }
  else {
    if (ar->end1 < this->start1) {
      mergeAlignmentRecordsSingle(this,ar,1,2);
      uVar16 = ar->end1;
      this->start1 = ar->start1;
      this->end1 = uVar16;
      this->single_end = false;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                (&this->cigar1,&ar->cigar1);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward,&(ar->sequence1).forward);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward_qualities,&(ar->sequence1).forward_qualities);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward,&(ar->sequence1).backward);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward_qualities,&(ar->sequence1).backward_qualities);
      this->phred_sum1 = ar->phred_sum1;
      iVar19 = ar->length_incl_longdeletions1;
      this->length_incl_deletions1 = ar->length_incl_deletions1;
      this->length_incl_longdeletions1 = iVar19;
      std::vector<char,_std::allocator<char>_>::operator=(pvVar1,&ar->cigar1_unrolled);
      psVar3 = &sStack_a0.pn;
      pcVar5 = (ar->reference_seq1)._M_dataplus._M_p;
      _i = (pointer)psVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&i,pcVar5,pcVar5 + (ar->reference_seq1)._M_string_length);
      std::__cxx11::string::operator=((string *)&this->reference_seq1,(string *)&i);
      if (_i != (pointer)psVar3) {
        operator_delete(_i);
      }
      pcVar5 = (ar->alignSequence1)._M_dataplus._M_p;
      _i = (pointer)psVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&i,pcVar5,pcVar5 + (ar->alignSequence1)._M_string_length);
      std::__cxx11::string::operator=((string *)&this->alignSequence1,(string *)&i);
      if (_i != (pointer)psVar3) {
        operator_delete(_i);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&i,&ar->qualityList1);
      piVar6 = (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_i;
      (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)sStack_a0.px;
      (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)sStack_a0.pn.pi_;
      _i = (pointer)0x0;
      sStack_a0.px = (element_type *)0x0;
      sStack_a0.pn.pi_ = (sp_counted_base *)0x0;
      if (piVar6 != (pointer)0x0) {
        operator_delete(piVar6);
      }
      goto joined_r0x0016f3d8;
    }
    local_144 = local_144 + iVar12;
    if (iVar22 < iVar19) {
      while (ref_p_s_pos1 < iVar19) {
        noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos1,&q_p_pos1,&ref_p_s_pos1,
                       &ref_rel_pos2,1);
      }
      piVar21 = &ref_rel_pos1;
      while ((uint)ref_p_s_pos1 <= ar->end1) {
        overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&c_p_pos1,&q_pos1,&q_p_pos1
                     ,&ref_p_s_pos1,piVar21,1,1);
      }
      while ((uint)ref_p_s_pos1 < ar->start2) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,
                       piVar21,1);
      }
      ref_rel_pos2 = ref_rel_pos1;
      pcVar17 = (ar->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar4 = (ar->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar19 = local_14c;
      if (pcVar17 != pcVar4) {
        iVar22 = (int)pcVar4 + local_14c;
        iVar12 = (int)pcVar17;
        do {
          if (*pcVar17 != 'H') {
            iVar19 = local_14c;
            if (*pcVar17 != 'S') break;
            local_148 = local_148 + 1;
          }
          local_14c = local_14c + 1;
          pcVar17 = pcVar17 + 1;
          iVar19 = iVar22 - iVar12;
        } while (pcVar17 != pcVar4);
      }
      local_14c = iVar19;
      uVar16 = local_144;
      if ((int)local_140 < (int)local_144) {
        uVar16 = local_140;
      }
      while (ref_p_s_pos1 <= (int)uVar16) {
        overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&local_14c,&q_pos1,
                     &local_148,&ref_p_s_pos1,piVar21,1,2);
      }
      ref_rel_pos2 = ref_rel_pos1 + -1;
      if (ref_p_s_pos1 - 1U == local_140) {
        while (ref_p_s_pos1 <= (int)local_144) {
          noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,
                         piVar21,1);
        }
        iVar19 = 1;
        pAVar20 = this;
LAB_00170246:
        updateReference(pAVar20,&ref,iVar19,*piVar21);
      }
      else if (ref_p_s_pos1 - 1U == local_144) {
        while (ref_p_s_pos1 <= (int)local_140) {
          noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&local_14c,&local_148,&ref_p_s_pos1,
                         &ref_rel_pos2,2);
        }
        iVar19 = 2;
        piVar21 = &ref_rel_pos2;
        pAVar20 = ar;
        goto LAB_00170246;
      }
      uVar16 = this->start1;
      if (ar->start1 < this->start1) {
        uVar16 = ar->start1;
      }
      this->start1 = uVar16;
      uVar16 = this->end1;
      if (this->end1 < ar->end2) {
        uVar16 = ar->end2;
      }
      this->end1 = uVar16;
      this->single_end = true;
      createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
      pCVar7 = (this->cigar1).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start = _i;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)sStack_a0.px;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sStack_a0.pn.pi_;
      _i = (pointer)0x0;
      sStack_a0.px = (element_type *)0x0;
      sStack_a0.pn.pi_ = (sp_counted_base *)0x0;
      if (pCVar7 != (pointer)0x0) {
        operator_delete(pCVar7);
      }
      if (_i != (pointer)0x0) {
        operator_delete(_i);
      }
      ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward,&sStack_a0);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward_qualities,&local_90);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward,&local_80);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward_qualities,&local_70);
      ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
      if (qualities._M_string_length == 0) {
        iVar19 = 0;
      }
      else {
        sVar18 = 0;
        iVar19 = 0;
        do {
          iVar19 = iVar19 + qualities._M_dataplus._M_p[sVar18] + -0x21;
          sVar18 = sVar18 + 1;
        } while (qualities._M_string_length != sVar18);
      }
      this->phred_sum1 = iVar19;
      sVar14 = ShortDnaSequence::size(&this->sequence1);
      this->length_incl_deletions1 = (int)sVar14;
      sVar14 = ShortDnaSequence::size(&this->sequence1);
      _Var11 = nucigar._M_dataplus;
      this->length_incl_longdeletions1 = (int)sVar14;
      pcVar8 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar8) {
        (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar8;
      }
      if (nucigar._M_string_length != 0) {
        sVar18 = 0;
        do {
          _i = (pointer)CONCAT71(uStack_a7,_Var11._M_p[sVar18]);
          iVar9._M_current =
               (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)pvVar1,iVar9,&i);
          }
          else {
            *iVar9._M_current = _Var11._M_p[sVar18];
            ppcVar2 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar2 = *ppcVar2 + 1;
          }
          sVar18 = sVar18 + 1;
        } while (nucigar._M_string_length != sVar18);
      }
      std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
      std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
    }
    else {
      piVar21 = &ref_rel_pos1;
      while (ref_s_pos1 < iVar22) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,piVar21,
                       1);
      }
      while ((uint)ref_s_pos1 <= ar->end1) {
        overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&c_p_pos1,&q_pos1,&q_p_pos1
                     ,&ref_s_pos1,piVar21,1,1);
      }
      while (iVar19 = ref_rel_pos1, (uint)ref_s_pos1 < ar->start2) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,piVar21,
                       1);
      }
      ref_rel_pos2 = ref_rel_pos1;
      pcVar17 = (ar->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar4 = (ar->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar12 = local_14c;
      if (pcVar17 != pcVar4) {
        iVar13 = (int)pcVar4 + local_14c;
        iVar22 = (int)pcVar17;
        do {
          if (*pcVar17 != 'H') {
            iVar12 = local_14c;
            if (*pcVar17 != 'S') break;
            local_148 = local_148 + 1;
          }
          local_14c = local_14c + 1;
          pcVar17 = pcVar17 + 1;
          iVar12 = iVar13 - iVar22;
        } while (pcVar17 != pcVar4);
      }
      local_14c = iVar12;
      uVar16 = local_144;
      if ((int)local_140 < (int)local_144) {
        uVar16 = local_140;
      }
      while (ref_s_pos1 <= (int)uVar16) {
        overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&local_14c,&q_pos1,
                     &local_148,&ref_s_pos1,piVar21,1,2);
      }
      ref_rel_pos2 = ref_rel_pos1 - iVar19;
      if (ref_s_pos1 - 1U == local_140) {
        while (ref_s_pos1 <= (int)local_144) {
          noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                         piVar21,1);
        }
        iVar19 = 1;
        pAVar20 = this;
LAB_001706dc:
        updateReference(pAVar20,&ref,iVar19,*piVar21);
      }
      else if (ref_s_pos1 - 1U == local_144) {
        piVar21 = &ref_rel_pos2;
        while (ref_s_pos1 <= (int)local_140) {
          noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&local_14c,&local_148,&ref_s_pos1,
                         piVar21,2);
        }
        iVar19 = 2;
        pAVar20 = ar;
        goto LAB_001706dc;
      }
      uVar16 = this->start1;
      if (ar->start1 < this->start1) {
        uVar16 = ar->start1;
      }
      this->start1 = uVar16;
      uVar16 = this->end1;
      if (this->end1 < ar->end2) {
        uVar16 = ar->end2;
      }
      this->end1 = uVar16;
      this->single_end = true;
      createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
      pCVar7 = (this->cigar1).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start = _i;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)sStack_a0.px;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sStack_a0.pn.pi_;
      _i = (pointer)0x0;
      sStack_a0.px = (element_type *)0x0;
      sStack_a0.pn.pi_ = (sp_counted_base *)0x0;
      if (pCVar7 != (pointer)0x0) {
        operator_delete(pCVar7);
      }
      if (_i != (pointer)0x0) {
        operator_delete(_i);
      }
      ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward,&sStack_a0);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward_qualities,&local_90);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward,&local_80);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward_qualities,&local_70);
      ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
      if (qualities._M_string_length == 0) {
        iVar19 = 0;
      }
      else {
        sVar18 = 0;
        iVar19 = 0;
        do {
          iVar19 = iVar19 + qualities._M_dataplus._M_p[sVar18] + -0x21;
          sVar18 = sVar18 + 1;
        } while (qualities._M_string_length != sVar18);
      }
      this->phred_sum1 = iVar19;
      sVar14 = ShortDnaSequence::size(&this->sequence1);
      this->length_incl_deletions1 = (int)sVar14;
      sVar14 = ShortDnaSequence::size(&this->sequence1);
      _Var11 = nucigar._M_dataplus;
      this->length_incl_longdeletions1 = (int)sVar14;
      pcVar8 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar8) {
        (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar8;
      }
      if (nucigar._M_string_length != 0) {
        sVar18 = 0;
        do {
          _i = (pointer)CONCAT71(uStack_a7,_Var11._M_p[sVar18]);
          iVar9._M_current =
               (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)pvVar1,iVar9,&i);
          }
          else {
            *iVar9._M_current = _Var11._M_p[sVar18];
            ppcVar2 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar2 = *ppcVar2 + 1;
          }
          sVar18 = sVar18 + 1;
        } while (nucigar._M_string_length != sVar18);
      }
      std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
      std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
    }
    std::vector<int,std::allocator<int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((vector<int,std::allocator<int>> *)&this->qualityList1,qualities._M_dataplus._M_p,
               qualities._M_dataplus._M_p + qualities._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)algn._M_dataplus._M_p != &algn.field_2) {
    operator_delete(algn._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ref._M_dataplus._M_p != &ref.field_2) {
    operator_delete(ref._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nucigar._M_dataplus._M_p != &nucigar.field_2) {
    operator_delete(nucigar._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)qualities._M_dataplus._M_p != &qualities.field_2) {
    operator_delete(qualities._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dna._M_dataplus._M_p == &dna.field_2) {
    return;
  }
LAB_00170958:
  operator_delete(dna._M_dataplus._M_p);
  return;
}

Assistant:

void AlignmentRecord::mergeAlignmentRecordsMixed(const AlignmentRecord& ar){
    if(ar.isSingleEnd()){
        std::string dna, qualities, nucigar = "";
        std::string ref = "";
        std::string algn = "";
        int offset_s_f, offset_s_b, offset_p_f1, offset_p_f2, offset_p_b1, offset_p_b2 = 0;
        offset_s_f = computeOffset(ar.getCigar1Unrolled());
        offset_s_b = computeRevOffset(ar.getCigar1Unrolled());
        offset_p_f1 = computeOffset(this->cigar1_unrolled);
        offset_p_f2 = computeOffset(this->cigar2_unrolled);
        offset_p_b1 = computeRevOffset(this->cigar1_unrolled);
        offset_p_b2 = computeRevOffset(this->cigar2_unrolled);
        int ref_s_pos1 = ar.getStart1()-offset_s_f;
        int ref_e_pos1 = ar.getEnd1()+offset_s_b;
        int ref_p_s_pos1 = this->start1-offset_p_f1;
        int ref_p_e_pos1 = this->end1+offset_p_b1;
        int ref_p_s_pos2 = this->start2-offset_p_f2;
        int ref_p_e_pos2 = this->end2+offset_p_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_p_pos1 = 0;
        int q_p_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_p_pos1 = 0;
        int c_p_pos2 = 0;
        //Position in the reference strings
        int ref_rel_pos1 =0;
        int ref_rel_pos2 =0;
        //int i;
        // ---------     -------- ->this (second read not changed)
        //----------
        if(ar.getEnd1() < this->start2){
            mergeAlignmentRecordsSingle(ar,1,1);
            this->single_end = false;
            assert(this->end1 < this->start2);
        } // -------     -------- ->this (second read not changed)
        //             ----------
        else if (ar.getStart1() > this->end1){
            mergeAlignmentRecordsSingle(ar,2,1);
            assert(this->end1 < this->start2);
        } //----------          -----------   ->this OR  -------       -----------
        //-------------------------------              -----------------------------
        else if(ref_s_pos1 <= ref_p_s_pos1){
            while(ref_s_pos1<ref_p_s_pos1){
                ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos1, q_pos1,ref_s_pos1,ref_rel_pos2,1);
            }
            while(ref_s_pos1<=this->end1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos1,c_pos1,q_p_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1,1);
            }
            ref_rel_pos2 += ref_rel_pos1;
            while(ref_s_pos1<this->start2){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos2,1);
            }
            ref_rel_pos1 = 0;
            computeSOffset(this->cigar2_unrolled,c_p_pos2,q_p_pos2);
            while(ref_s_pos1<=ref_p_e_pos2 && ref_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos2,c_pos1,q_p_pos2,q_pos1,ref_s_pos1,ref_rel_pos1,2,1);
            }
            ref_rel_pos2 += ref_rel_pos1;
            if(ref_s_pos1-1 == ref_p_e_pos2){
                while(ref_s_pos1<=ref_e_pos1){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos2,1);
                }
                ar.updateReference(ref,1,ref_rel_pos2);
            } else if (ref_s_pos1-1 == ref_e_pos1){
                while(ref_s_pos1<=ref_p_e_pos2){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_s_pos1,ref_rel_pos1,2);
                }
                updateReference(ref,2,ref_rel_pos1);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end2);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());
        } //----------          ------------ ->this OR ----------       -----------
        //     -------------------------------            ----------------------
        else if(ref_s_pos1 >= ref_p_s_pos1){
            while(ref_p_s_pos1 < ref_s_pos1){
                noOverlapMerge(algn,ref,dna,qualities,nucigar, c_p_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos1,1);
            }
            ref_rel_pos2 = ref_rel_pos1;
            while(ref_p_s_pos1<=this->end1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos1,c_pos1,q_p_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1,1);
            }
            ref_rel_pos2 = ref_rel_pos1 - ref_rel_pos2 ;
            while(ref_p_s_pos1<this->start2){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos2,1);
            }
            ref_rel_pos1 = 0;
            computeSOffset(this->cigar2_unrolled,c_p_pos2,q_p_pos2);
            while(ref_p_s_pos1<=ref_p_e_pos2 && ref_p_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos2,c_pos1,q_p_pos2,q_pos1,ref_p_s_pos1,ref_rel_pos1,2,1);
            }
            ref_rel_pos2 += ref_rel_pos1-1;
            if(ref_p_s_pos1-1 == ref_p_e_pos2){
                while(ref_p_s_pos1<=ref_e_pos1){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos2,1);
                }
                ar.updateReference(ref,1,ref_rel_pos2);
            } else if (ref_p_s_pos1-1 == ref_e_pos1){
                while(ref_p_s_pos1<=ref_p_e_pos2){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_p_s_pos1,ref_rel_pos1,2);
                }
                updateReference(ref,2,ref_rel_pos1);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end2);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());
        }
    }
    else if (ar.isPairedEnd()){
        std::string dna, qualities, nucigar = "";
        std::string ref = "";
        std::string algn = "";
        int offset_s_f, offset_s_b, offset_p_f1, offset_p_f2, offset_p_b1, offset_p_b2 = 0;
        //get starting position and ending position according to ref position, paying attention to clipped bases
        //updated ref position including clips
        offset_s_f = computeOffset(this->cigar1_unrolled);
        offset_s_b = computeRevOffset(this->cigar1_unrolled);
        offset_p_f1 = computeOffset(ar.getCigar1Unrolled());
        offset_p_f2 = computeOffset(ar.getCigar2Unrolled());
        offset_p_b1 = computeRevOffset(ar.getCigar1Unrolled());
        offset_p_b2 = computeRevOffset(ar.getCigar2Unrolled());
        int ref_s_pos1 = this->start1-offset_s_f;
        int ref_e_pos1 = this->end1+offset_s_b;
        int ref_p_s_pos1 = ar.getStart1()-offset_p_f1;
        //int ref_p_e_pos1 = ar.getEnd1()+offset_p_b1;
        //int ref_p_s_pos2 = ar.getStart2()-offset_p_f2;
        int ref_p_e_pos2 = ar.getEnd2()+offset_p_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_p_pos1 = 0;
        int q_p_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_p_pos1 = 0;
        int c_p_pos2 = 0;
        //Position in the reference strings
        int ref_rel_pos1 =0;
        int ref_rel_pos2 =0;
        // ---------  -----------          OR ---------- ------------
        // ---------               ->this                -------------
        if(this->end1 < ar.getStart2()){
            mergeAlignmentRecordsSingle(ar,1,1);
            this->start2 = ar.getStart2();
            this->end2=ar.getEnd2();
            this->single_end= false;
            this->cigar2 = ar.getCigar2();
            this->sequence2=ar.getSequence2();
            this->phred_sum2=ar.getPhredSum2();
            this->length_incl_deletions2 = ar.getLengthInclDeletions2();
            this->length_incl_longdeletions2 = ar.getLengthInclLongDeletions2();
            this->cigar2_unrolled = ar.getCigar2Unrolled();
            this->reference_seq2 = ar.getReferenceSeq2();
            this->alignSequence2 = ar.getAlignSequence2();
            this->qualityList2 = ar.getQualityList2();
        } else if (this->start1 > ar.getEnd1()){
            mergeAlignmentRecordsSingle(ar,1,2);
            this->start1= ar.getStart1();
            this->end1=ar.getEnd1();
            this->single_end= false;
            this->cigar1 = ar.getCigar1();
            this->sequence1=ar.getSequence1();
            this->phred_sum1=ar.getPhredSum1();
            this->length_incl_deletions1 = ar.getLengthInclDeletions1();
            this->length_incl_longdeletions1 = ar.getLengthInclLongDeletions1();
            this->cigar1_unrolled = ar.getCigar1Unrolled();
            this->reference_seq1 = ar.getReferenceSeq1();
            this->alignSequence1 = ar.getAlignSequence1();
            this->qualityList1 = ar.getQualityList1();
        }//----------          -----------        OR  -------       -----------
        //----------------------------    <-this    -----------------------------
        else if(ref_s_pos1 <= ref_p_s_pos1){
                while(ref_s_pos1<ref_p_s_pos1){
                    noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos1, q_pos1,ref_s_pos1,ref_rel_pos1,1);
                }
                while(ref_s_pos1<=ar.getEnd1()){
                    overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos1,q_pos1,q_p_pos1,ref_s_pos1,ref_rel_pos1,1,1);
                }
                while(ref_s_pos1<ar.getStart2()){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1);
                }
                ref_rel_pos2 = ref_rel_pos1;
                computeSOffset(ar.getCigar2Unrolled(),c_p_pos2,q_p_pos2);

                while(ref_s_pos1<=ref_p_e_pos2 && ref_s_pos1 <=ref_e_pos1){
                    overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos2,q_pos1,q_p_pos2,ref_s_pos1,ref_rel_pos1,1,2);
                }
                ref_rel_pos2 = ref_rel_pos1 -ref_rel_pos2;
                if(ref_s_pos1-1 == ref_p_e_pos2){
                    while(ref_s_pos1<=ref_e_pos1){
                        noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1);
                    }
                    updateReference(ref,1,ref_rel_pos1);
                } else if (ref_s_pos1-1 == ref_e_pos1){
                    while(ref_s_pos1<=ref_p_e_pos2){
                        ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_s_pos1,ref_rel_pos2,2);
                    }
                    ar.updateReference(ref,2,ref_rel_pos2);
                }
                this->start1=std::min(this->start1,ar.getStart1());
                this->end1=std::max(ar.getEnd2(),this->end1);
                this->single_end = true;
                this->cigar1=createCigar(nucigar);
                this->sequence1=ShortDnaSequence(dna,qualities);
                this->phred_sum1=phred_sum(qualities);
                this->length_incl_deletions1 = this->sequence1.size();
                this->length_incl_longdeletions1 = this->sequence1.size();
                this->cigar1_unrolled.clear();
                for (char i : nucigar){
                    this->cigar1_unrolled.push_back(i);
                }
                this->reference_seq1 = ref;
                this->alignSequence1 = algn;
                this->qualityList1.assign(qualities.begin(), qualities.end());

        }//----------          ------------        OR ----------       -----------
        //     -------------------------------   <-this   ----------------------
        else if(ref_s_pos1 >= ref_p_s_pos1){
            while(ref_p_s_pos1 < ref_s_pos1){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar, c_p_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos2,1);
            }
            while(ref_p_s_pos1<=ar.getEnd1()){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos1,q_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos1,1,1);
            }

            while(ref_p_s_pos1<ar.getStart2()){
                noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1);
            }
            ref_rel_pos2 = ref_rel_pos1;
            computeSOffset(ar.getCigar2Unrolled(),c_p_pos2,q_p_pos2);
            while(ref_p_s_pos1<=ref_p_e_pos2 && ref_p_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos2,q_pos1,q_p_pos2,ref_p_s_pos1,ref_rel_pos1,1,2);
            }
            ref_rel_pos2 = ref_rel_pos1 -1;
            if(ref_p_s_pos1-1 == ref_p_e_pos2){
                while(ref_p_s_pos1<=ref_e_pos1){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1);
                }
                updateReference(ref,1,ref_rel_pos1);
            } else if (ref_p_s_pos1-1 == ref_e_pos1){
                while(ref_p_s_pos1<=ref_p_e_pos2){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_p_s_pos1,ref_rel_pos2,2);
                }
                ar.updateReference(ref,2,ref_rel_pos2);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd2(),this->end1);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(), qualities.end());
        }
    }
}